

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O3

intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
* __thiscall
burst::
make_intersect_iterator<std::initializer_list<int>,std::initializer_list<int>,std::initializer_list<int>>
          (intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          tuple<std::initializer_list<int>_&,_std::initializer_list<int>_&,_std::initializer_list<int>_&>
          *ranges)

{
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  *ranges_00;
  vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
  local_70;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>_>
  local_58;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)(this + 0x10);
  local_28 = *(undefined4 *)this;
  uStack_24 = *(undefined4 *)(this + 4);
  uStack_20 = *(undefined4 *)(this + 8);
  uStack_1c = *(undefined4 *)(this + 0xc);
  detail::
  apply_impl<burst::make_range_vector_t_const&,std::tuple<std::initializer_list<int>&,std::initializer_list<int>&,std::initializer_list<int>&>&,0ul,1ul,2ul>
            (&local_70,(detail *)&make_range_vector);
  own_as_range_t::operator()(&local_58,(own_as_range_t *)&own_as_range,&local_70);
  make_intersect_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>>
            (__return_storage_ptr__,(burst *)&local_58,ranges_00);
  if (local_58.
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_58.
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_70.
      super__Vector_base<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto make_intersect_iterator (std::tuple<Ranges &...> ranges)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_intersect_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges))
            );
    }